

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cc
# Opt level: O2

void __thiscall
xemmai::ast::t_lambda::f_safe_points
          (t_lambda *this,t_code *a_code,
          map<std::pair<unsigned_long,_void_**>,_unsigned_long,_std::less<std::pair<unsigned_long,_void_**>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_void_**>,_unsigned_long>_>_>
          *a_safe_points,
          vector<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>
          *a_safe_positions)

{
  map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_xemmai::t_code::t_variable,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_xemmai::t_code::t_variable>_>_>
  *this_00;
  pointer ptVar1;
  _Rb_tree_node_base *p_Var2;
  tuple<unsigned_long,_unsigned_long,_unsigned_long> *x;
  pointer __args_1;
  t_scope *ptVar3;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_80;
  t_variable local_60;
  wstring prefix;
  
  local_60.v_varies = false;
  local_60.v_shared = (this->super_t_scope).v_self_shared;
  local_60.v_index = -((ulong)local_60.v_shared ^ 1);
  this_00 = &a_code->v_variables;
  prefix._M_dataplus._M_p = (pointer)0x1;
  prefix._M_string_length = (size_type)anon_var_dwarf_be26a;
  std::
  _Rb_tree<std::__cxx11::wstring,std::pair<std::__cxx11::wstring_const,xemmai::t_code::t_variable>,std::_Select1st<std::pair<std::__cxx11::wstring_const,xemmai::t_code::t_variable>>,std::less<void>,std::allocator<std::pair<std::__cxx11::wstring_const,xemmai::t_code::t_variable>>>
  ::
  _M_emplace_unique<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>,xemmai::t_code::t_variable&>
            ((_Rb_tree<std::__cxx11::wstring,std::pair<std::__cxx11::wstring_const,xemmai::t_code::t_variable>,std::_Select1st<std::pair<std::__cxx11::wstring_const,xemmai::t_code::t_variable>>,std::less<void>,std::allocator<std::pair<std::__cxx11::wstring_const,xemmai::t_code::t_variable>>>
              *)this_00,(basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&prefix,&local_60)
  ;
  for (p_Var2 = (this->super_t_scope).v_variables._M_t._M_impl.super__Rb_tree_header._M_header.
                _M_left;
      (_Rb_tree_header *)p_Var2 !=
      &(this->super_t_scope).v_variables._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    std::
    _Rb_tree<std::__cxx11::wstring,std::pair<std::__cxx11::wstring_const,xemmai::t_code::t_variable>,std::_Select1st<std::pair<std::__cxx11::wstring_const,xemmai::t_code::t_variable>>,std::less<void>,std::allocator<std::pair<std::__cxx11::wstring_const,xemmai::t_code::t_variable>>>
    ::_M_emplace_unique<std::__cxx11::wstring_const&,xemmai::t_code::t_variable&>
              ((_Rb_tree<std::__cxx11::wstring,std::pair<std::__cxx11::wstring_const,xemmai::t_code::t_variable>,std::_Select1st<std::pair<std::__cxx11::wstring_const,xemmai::t_code::t_variable>>,std::less<void>,std::allocator<std::pair<std::__cxx11::wstring_const,xemmai::t_code::t_variable>>>
                *)this_00,
               (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               (*(long *)(*(long *)(p_Var2 + 1) + 0x48) + 0x20),(t_variable *)&p_Var2[1]._M_parent);
  }
  ptVar3 = &this->super_t_scope;
  prefix._M_dataplus._M_p = (pointer)&prefix.field_2;
  prefix._M_string_length = 0;
  prefix.field_2._M_local_buf[0] = L'\0';
  local_60.v_shared = true;
  local_60.v_index = 0;
  while (ptVar3 = ptVar3->v_outer, ptVar3 != (t_scope *)0x0) {
    std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>::
    push_back(&prefix,L':');
    if (ptVar3->v_self_shared == true) {
      std::operator+(&local_80,&prefix,L'$');
      std::
      _Rb_tree<std::__cxx11::wstring,std::pair<std::__cxx11::wstring_const,xemmai::t_code::t_variable>,std::_Select1st<std::pair<std::__cxx11::wstring_const,xemmai::t_code::t_variable>>,std::less<void>,std::allocator<std::pair<std::__cxx11::wstring_const,xemmai::t_code::t_variable>>>
      ::_M_emplace_unique<std::__cxx11::wstring,xemmai::t_code::t_variable&>
                ((_Rb_tree<std::__cxx11::wstring,std::pair<std::__cxx11::wstring_const,xemmai::t_code::t_variable>,std::_Select1st<std::pair<std::__cxx11::wstring_const,xemmai::t_code::t_variable>>,std::less<void>,std::allocator<std::pair<std::__cxx11::wstring_const,xemmai::t_code::t_variable>>>
                  *)this_00,&local_80,&local_60);
      std::__cxx11::wstring::~wstring((wstring *)&local_80);
    }
    for (p_Var2 = (ptVar3->v_variables)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var2 != &(ptVar3->v_variables)._M_t._M_impl.super__Rb_tree_header;
        p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
      if (*(char *)&p_Var2[1]._M_parent == '\x01') {
        std::operator+(&local_80,&prefix,
                       (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *
                       )(*(long *)(*(long *)(p_Var2 + 1) + 0x48) + 0x20));
        std::
        _Rb_tree<std::__cxx11::wstring,std::pair<std::__cxx11::wstring_const,xemmai::t_code::t_variable>,std::_Select1st<std::pair<std::__cxx11::wstring_const,xemmai::t_code::t_variable>>,std::less<void>,std::allocator<std::pair<std::__cxx11::wstring_const,xemmai::t_code::t_variable>>>
        ::_M_emplace_unique<std::__cxx11::wstring,xemmai::t_code::t_variable&>
                  ((_Rb_tree<std::__cxx11::wstring,std::pair<std::__cxx11::wstring_const,xemmai::t_code::t_variable>,std::_Select1st<std::pair<std::__cxx11::wstring_const,xemmai::t_code::t_variable>>,std::less<void>,std::allocator<std::pair<std::__cxx11::wstring_const,xemmai::t_code::t_variable>>>
                    *)this_00,&local_80,(t_variable *)&p_Var2[1]._M_parent);
        std::__cxx11::wstring::~wstring((wstring *)&local_80);
      }
    }
  }
  ptVar1 = (a_safe_positions->
           super__Vector_base<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (__args_1 = (a_safe_positions->
                  super__Vector_base<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>
                  )._M_impl.super__Vector_impl_data._M_start; __args_1 != ptVar1;
      __args_1 = __args_1 + 1) {
    local_80._M_dataplus._M_p =
         (pointer)(__args_1->super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_unsigned_long>).
                  super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
    local_80._M_string_length =
         (size_type)
         ((a_code->v_instructions).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
          super__Vector_impl_data._M_start +
         (__args_1->super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_unsigned_long>).
         super__Tuple_impl<1UL,_unsigned_long,_unsigned_long>.
         super__Head_base<1UL,_unsigned_long,_false>._M_head_impl);
    std::
    _Rb_tree<std::pair<unsigned_long,void**>,std::pair<std::pair<unsigned_long,void**>const,unsigned_long>,std::_Select1st<std::pair<std::pair<unsigned_long,void**>const,unsigned_long>>,std::less<std::pair<unsigned_long,void**>>,std::allocator<std::pair<std::pair<unsigned_long,void**>const,unsigned_long>>>
    ::_M_emplace_unique<std::pair<unsigned_long,void**>,unsigned_long_const&>
              ((_Rb_tree<std::pair<unsigned_long,void**>,std::pair<std::pair<unsigned_long,void**>const,unsigned_long>,std::_Select1st<std::pair<std::pair<unsigned_long,void**>const,unsigned_long>>,std::less<std::pair<unsigned_long,void**>>,std::allocator<std::pair<std::pair<unsigned_long,void**>const,unsigned_long>>>
                *)a_safe_points,(pair<unsigned_long,_void_**> *)&local_80,(unsigned_long *)__args_1)
    ;
  }
  std::__cxx11::wstring::~wstring((wstring *)&prefix);
  return;
}

Assistant:

void t_lambda::f_safe_points(t_code& a_code, std::map<std::pair<size_t, void**>, size_t>& a_safe_points, const std::vector<std::tuple<size_t, size_t, size_t>>& a_safe_positions)
{
	t_code::t_variable self;
	self.v_shared = v_self_shared;
	self.v_index = v_self_shared ? 0 : -1;
	a_code.v_variables.emplace(L"$"sv, self);
	for (auto& pair : v_variables) a_code.v_variables.emplace(pair.first->f_as<t_symbol>().f_string(), pair.second);
	std::wstring prefix;
	self.v_shared = true;
	self.v_index = 0;
	for (auto scope = v_outer; scope; scope = scope->v_outer) {
		prefix += L':';
		if (scope->v_self_shared) a_code.v_variables.emplace(prefix + L'$', self);
		for (auto& pair : scope->v_variables) if (pair.second.v_shared) a_code.v_variables.emplace(prefix + pair.first->f_as<t_symbol>().f_string(), pair.second);
	}
	for (auto& x : a_safe_positions) a_safe_points.emplace(std::make_pair(std::get<0>(x), &a_code.v_instructions[std::get<1>(x)]), std::get<2>(x));
}